

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O3

enable_if_t<std::is_arithmetic<unsigned_int>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_int>::operator()
          (void *this,string *out,uint in)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  cVar3 = '\x01';
  if (9 < in) {
    uVar4 = in;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar4 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0020b603;
      }
      if (uVar4 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0020b603;
      }
      if (uVar4 < 10000) goto LAB_0020b603;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_0020b603:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,in);
  std::__cxx11::string::operator=((string *)out,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }